

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegularExpression.cpp
# Opt level: O3

bool __thiscall
xercesc_4_0::RegularExpression::matchBackReference
          (RegularExpression *this,Context *context,XMLInt32 refNo,XMLSize_t *offset,bool ignoreCase
          )

{
  XMLCh *str1;
  bool bVar1;
  int iVar2;
  int iVar3;
  IllegalArgumentException *this_00;
  int offset1;
  XMLSize_t charCount;
  
  if ((refNo < 1) || (this->fNoGroups <= refNo)) {
    this_00 = (IllegalArgumentException *)__cxa_allocate_exception(0x30);
    IllegalArgumentException::IllegalArgumentException
              (this_00,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/regx/RegularExpression.cpp"
               ,0x528,Regex_BadRefNo,context->fMemoryManager);
    __cxa_throw(this_00,&IllegalArgumentException::typeinfo,XMLException::~XMLException);
  }
  iVar2 = Match::getStartPos(context->fMatch,refNo);
  bVar1 = true;
  if ((-1 < iVar2) && (iVar2 = Match::getEndPos(context->fMatch,refNo), -1 < iVar2)) {
    iVar2 = Match::getStartPos(context->fMatch,refNo);
    iVar3 = Match::getEndPos(context->fMatch,refNo);
    offset1 = (int)*offset;
    if (iVar3 - iVar2 <= (int)context->fLimit - offset1) {
      str1 = context->fString;
      charCount = (XMLSize_t)(iVar3 - iVar2);
      if (ignoreCase) {
        bVar1 = XMLString::regionIMatches(str1,offset1,str1,iVar2,charCount);
      }
      else {
        bVar1 = XMLString::regionMatches(str1,offset1,str1,iVar2,charCount);
      }
      if (bVar1 != false) {
        *offset = *offset + charCount;
        return true;
      }
    }
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool RegularExpression::matchBackReference(Context* const context,
                                           const XMLInt32 refNo, XMLSize_t& offset,
                                           const bool ignoreCase) const
{
    if (refNo <=0 || refNo >= fNoGroups)
        ThrowXMLwithMemMgr(IllegalArgumentException, XMLExcepts::Regex_BadRefNo, context->fMemoryManager);

    // If the group we're matching against wasn't matched,
    // the back reference matches the empty string
    if (context->fMatch->getStartPos(refNo) < 0 || context->fMatch->getEndPos(refNo) < 0)
        return true;

    int start = context->fMatch->getStartPos(refNo);
    int length = context->fMatch->getEndPos(refNo) - start;

    if (int(context->fLimit - offset) < length)
        return false;

    bool match = ignoreCase ? XMLString::regionIMatches(context->fString,(int)offset,
                                                        context->fString,start,length)
                            : XMLString::regionMatches(context->fString, (int)offset,
                                                       context->fString, start,length);

    if (match) offset += length;
    return match;
}